

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O2

string * __thiscall
FIX::UtcTimeStampConvertor::convert_abi_cxx11_
          (string *__return_storage_ptr__,UtcTimeStampConvertor *this,UtcTimeStamp *value,
          int precision)

{
  int iVar1;
  int fraction;
  int second;
  int minute;
  int hour;
  int year;
  int precision_local;
  char result [27];
  int day;
  int month;
  
  result[0] = '\0';
  result[1] = '\0';
  result[2] = '\0';
  result[3] = '\0';
  precision_local = (int)value;
  year = 9;
  precision_local = clamp_of<int>(&precision_local,(int *)result,&year);
  DateTime::getYMD((DateTime *)this,&year,&month,&day);
  DateTime::getHMS((DateTime *)this,&hour,&minute,&second,&fraction,precision_local);
  integer_to_string_padded<int>(result,4,year,'0');
  integer_to_string_padded<int>(result + 4,2,month,'0');
  integer_to_string_padded<int>(result + 6,2,day,'0');
  result[8] = '-';
  integer_to_string_padded<int>(result + 9,2,hour,'0');
  result[0xb] = ':';
  integer_to_string_padded<int>(result + 0xc,2,minute,'0');
  result[0xe] = ':';
  integer_to_string_padded<int>(result + 0xf,2,second,'0');
  if ((long)precision_local != 0) {
    result[0x11] = '.';
    integer_to_string_padded<int>(result + 0x12,(long)precision_local,fraction,'0');
    if (precision_local != 0) {
      iVar1 = precision_local + 0x12;
      goto LAB_00187ed3;
    }
  }
  iVar1 = 0x11;
LAB_00187ed3:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,result,result + iVar1);
  return __return_storage_ptr__;
}

Assistant:

EXCEPT(FieldConvertError) {
    char result[17 + 10]; // Maximum
    int year, month, day, hour, minute, second, fraction;

    precision = clamp_of(precision, 0, 9);

    value.getYMD(year, month, day);
    value.getHMS(hour, minute, second, fraction, precision);

    integer_to_string_padded(result, 4, year);
    integer_to_string_padded(result + 4, 2, month);
    integer_to_string_padded(result + 6, 2, day);
    result[8] = '-';
    integer_to_string_padded(result + 9, 2, hour);
    result[11] = ':';
    integer_to_string_padded(result + 12, 2, minute);
    result[14] = ':';
    integer_to_string_padded(result + 15, 2, second);

    if (precision) {
      result[17] = '.';
      integer_to_string_padded(result + 18, precision, fraction);
    }

    return std::string(result, precision ? (17 + 1 + precision) : 17);
  }